

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QMdi::Rearranger_*>::relocate
          (QArrayDataPointer<QMdi::Rearranger_*> *this,qsizetype offset,Rearranger ***data)

{
  Rearranger **d_first;
  Rearranger **ppRVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QMdi::Rearranger*,long_long>(this->ptr,this->size,d_first);
  if (data != (Rearranger ***)0x0) {
    ppRVar1 = *data;
    if ((this->ptr <= ppRVar1) && (ppRVar1 < this->ptr + this->size)) {
      *data = ppRVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }